

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_extract_to_callback
                  (mz_zip_archive *pZip,mz_uint file_index,mz_file_write_func pCallback,
                  void *pOpaque,mz_uint flags)

{
  mz_bool mVar1;
  long lVar2;
  size_t sVar3;
  mz_ulong mVar4;
  ulong uVar5;
  mz_uint8 *ptr;
  size_t sVar6;
  undefined8 in_RCX;
  code *in_RDX;
  ulong *in_RDI;
  uint in_R8D;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint8 *pWrite_buf_cur;
  tinfl_decompressor inflator;
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  void *pWrite_buf;
  void *pRead_buf;
  mz_zip_archive_file_stat file_stat;
  mz_uint64 cur_file_ofs;
  mz_uint64 out_buf_ofs;
  mz_uint64 comp_remaining;
  mz_uint64 read_buf_avail;
  mz_uint64 read_buf_ofs;
  mz_uint64 read_buf_size;
  mz_uint file_crc32;
  int status;
  bool local_3119;
  ulong local_3118;
  ulong local_3110;
  mz_zip_archive_file_stat *in_stack_ffffffffffffcef8;
  undefined8 in_stack_ffffffffffffcf00;
  mz_zip_archive *in_stack_ffffffffffffcf08;
  size_t *in_stack_ffffffffffffd150;
  mz_uint8 *in_stack_ffffffffffffd158;
  mz_uint8 *in_stack_ffffffffffffd160;
  size_t *in_stack_ffffffffffffd168;
  mz_uint8 *in_stack_ffffffffffffd170;
  tinfl_decompressor *in_stack_ffffffffffffd178;
  mz_uint32 in_stack_ffffffffffffd190;
  int local_5e8 [6];
  ushort local_5ce;
  ushort local_5cc;
  long local_5c8;
  mz_uint8 *local_5c0;
  ushort local_5a4;
  short local_5a2;
  uint local_598;
  ulong local_590;
  ulong local_588;
  long local_578;
  int local_56c;
  long local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  long local_140;
  ulong local_138;
  uint local_12c;
  tinfl_status local_128;
  uint local_124;
  undefined8 local_120;
  code *local_118;
  ulong *local_108;
  uint local_100;
  undefined4 local_fc;
  ulong *local_f8;
  undefined4 local_ec;
  ulong *local_e8;
  undefined4 local_dc;
  ulong *local_d8;
  undefined4 local_cc;
  ulong *local_c8;
  undefined4 local_bc;
  ulong *local_b8;
  undefined4 local_ac;
  ulong *local_a8;
  undefined4 local_9c;
  ulong *local_98;
  undefined4 local_8c;
  ulong *local_88;
  undefined4 local_7c;
  ulong *local_78;
  
  local_128 = TINFL_STATUS_DONE;
  local_12c = 0;
  local_140 = 0;
  local_158 = 0;
  local_5c0 = (mz_uint8 *)0x0;
  local_5c8 = 0;
  if ((((in_RDI == (ulong *)0x0) || (in_RDI[0xd] == 0)) || (in_RDX == (code *)0x0)) ||
     (in_RDI[9] == 0)) {
    if (in_RDI != (ulong *)0x0) {
      *(undefined4 *)((long)in_RDI + 0x1c) = 0x18;
    }
    local_100 = 0;
  }
  else {
    local_124 = in_R8D;
    local_120 = in_RCX;
    local_118 = in_RDX;
    local_108 = in_RDI;
    mVar1 = mz_zip_reader_file_stat
                      (in_stack_ffffffffffffcf08,(mz_uint)((ulong)in_stack_ffffffffffffcf00 >> 0x20)
                       ,in_stack_ffffffffffffcef8);
    if (mVar1 == 0) {
      local_100 = 0;
    }
    else if ((local_56c == 0) && (local_590 != 0)) {
      if ((local_5a4 & 0x61) == 0) {
        if ((((local_124 & 0x400) == 0) && (local_5a2 != 0)) && (local_5a2 != 8)) {
          if (local_108 != (ulong *)0x0) {
            *(undefined4 *)((long)local_108 + 0x1c) = 4;
          }
          local_100 = 0;
        }
        else {
          local_160 = local_578;
          lVar2 = (*(code *)local_108[9])(local_108[0xc],local_578,local_5e8,0x1e);
          if (lVar2 == 0x1e) {
            if (local_5e8[0] == 0x4034b50) {
              local_160 = (int)(local_5ce + 0x1e + (uint)local_5cc) + local_160;
              if (*local_108 < local_160 + local_590) {
                if (local_108 != (ulong *)0x0) {
                  *(undefined4 *)((long)local_108 + 0x1c) = 9;
                }
                local_100 = 0;
              }
              else {
                if (*(long *)(local_108[0xd] + 0x80) == 0) {
                  local_138 = local_590;
                  if (0xffff < local_590) {
                    local_138 = 0x10000;
                  }
                  local_5c0 = (mz_uint8 *)(*(code *)local_108[5])(local_108[8],1,local_138);
                  if (local_5c0 == (mz_uint8 *)0x0) {
                    if (local_108 != (ulong *)0x0) {
                      *(undefined4 *)((long)local_108 + 0x1c) = 0x10;
                    }
                    return 0;
                  }
                  local_148 = 0;
                  local_150 = local_590;
                }
                else {
                  local_5c0 = (mz_uint8 *)(*(long *)(local_108[0xd] + 0x80) + local_160);
                  local_148 = local_590;
                  local_138 = local_590;
                  local_150 = 0;
                }
                if (((local_124 & 0x400) == 0) && (local_5a2 != 0)) {
                  local_5c8 = (*(code *)local_108[5])(local_108[8],1,0x8000);
                  if (local_5c8 == 0) {
                    local_a8 = local_108;
                    local_ac = 0x10;
                    if (local_108 != (ulong *)0x0) {
                      *(undefined4 *)((long)local_108 + 0x1c) = 0x10;
                    }
                    local_128 = TINFL_STATUS_FAILED;
                  }
                  else {
                    do {
                      ptr = (mz_uint8 *)(local_5c8 + (local_158 & 0x7fff));
                      sVar3 = 0x8000 - (local_158 & 0x7fff);
                      if ((local_148 == 0) && (*(long *)(local_108[0xd] + 0x80) == 0)) {
                        if (local_138 < local_150) {
                          local_3118 = local_138;
                        }
                        else {
                          local_3118 = local_150;
                        }
                        local_148 = local_3118;
                        uVar5 = (*(code *)local_108[9])
                                          (local_108[0xc],local_160,local_5c0,local_3118);
                        if (uVar5 != local_148) {
                          local_b8 = local_108;
                          local_bc = 0x14;
                          if (local_108 != (ulong *)0x0) {
                            *(undefined4 *)((long)local_108 + 0x1c) = 0x14;
                          }
                          local_128 = TINFL_STATUS_FAILED;
                          break;
                        }
                        local_160 = local_148 + local_160;
                        local_150 = local_150 - local_148;
                        local_140 = 0;
                      }
                      uVar5 = local_148;
                      local_128 = tinfl_decompress(in_stack_ffffffffffffd178,
                                                   in_stack_ffffffffffffd170,
                                                   in_stack_ffffffffffffd168,
                                                   in_stack_ffffffffffffd160,
                                                   in_stack_ffffffffffffd158,
                                                   in_stack_ffffffffffffd150,
                                                   in_stack_ffffffffffffd190);
                      local_148 = local_148 - uVar5;
                      local_140 = uVar5 + local_140;
                      if (sVar3 != 0) {
                        sVar6 = (*local_118)(local_120,local_158,ptr,sVar3);
                        if (sVar6 != sVar3) {
                          local_c8 = local_108;
                          local_cc = 0x1f;
                          if (local_108 != (ulong *)0x0) {
                            *(undefined4 *)((long)local_108 + 0x1c) = 0x1f;
                          }
                          local_128 = TINFL_STATUS_FAILED;
                          break;
                        }
                        mVar4 = mz_crc32((ulong)local_12c,ptr,sVar3);
                        local_12c = (uint)mVar4;
                        local_158 = sVar3 + local_158;
                        if (local_588 < local_158) {
                          local_d8 = local_108;
                          local_dc = 0xb;
                          if (local_108 != (ulong *)0x0) {
                            *(undefined4 *)((long)local_108 + 0x1c) = 0xb;
                          }
                          local_128 = TINFL_STATUS_FAILED;
                          break;
                        }
                      }
                      local_3119 = local_128 == TINFL_STATUS_NEEDS_MORE_INPUT ||
                                   local_128 == TINFL_STATUS_HAS_MORE_OUTPUT;
                    } while (local_3119);
                  }
                }
                else if (*(long *)(local_108[0xd] + 0x80) == 0) {
                  for (; local_150 != 0; local_150 = local_150 - local_148) {
                    if (local_138 < local_150) {
                      local_3110 = local_138;
                    }
                    else {
                      local_3110 = local_150;
                    }
                    local_148 = local_3110;
                    sVar3 = (*(code *)local_108[9])(local_108[0xc],local_160,local_5c0,local_3110);
                    if (sVar3 != local_148) {
                      local_88 = local_108;
                      local_8c = 0x14;
                      if (local_108 != (ulong *)0x0) {
                        *(undefined4 *)((long)local_108 + 0x1c) = 0x14;
                      }
                      local_128 = TINFL_STATUS_FAILED;
                      break;
                    }
                    if ((local_124 & 0x400) == 0) {
                      mVar4 = mz_crc32((ulong)local_12c,local_5c0,local_148);
                      local_12c = (uint)mVar4;
                    }
                    uVar5 = (*local_118)(local_120,local_158,local_5c0,local_148);
                    if (uVar5 != local_148) {
                      local_98 = local_108;
                      local_9c = 0x1f;
                      if (local_108 != (ulong *)0x0) {
                        *(undefined4 *)((long)local_108 + 0x1c) = 0x1f;
                      }
                      local_128 = TINFL_STATUS_FAILED;
                      break;
                    }
                    local_160 = local_148 + local_160;
                    local_158 = local_148 + local_158;
                  }
                }
                else {
                  sVar3 = (*local_118)(local_120,local_158,local_5c0,local_590);
                  if (sVar3 == local_590) {
                    if ((local_124 & 0x400) == 0) {
                      mVar4 = mz_crc32((ulong)local_12c,local_5c0,local_590);
                      local_12c = (uint)mVar4;
                    }
                  }
                  else {
                    local_78 = local_108;
                    local_7c = 0x1f;
                    if (local_108 != (ulong *)0x0) {
                      *(undefined4 *)((long)local_108 + 0x1c) = 0x1f;
                    }
                    local_128 = TINFL_STATUS_FAILED;
                  }
                  local_160 = local_590 + local_160;
                  local_158 = local_590 + local_158;
                  local_150 = 0;
                }
                if ((local_128 == TINFL_STATUS_DONE) && ((local_124 & 0x400) == 0)) {
                  if (local_158 == local_588) {
                    if (local_12c != local_598) {
                      local_f8 = local_108;
                      local_fc = 0xb;
                      if (local_108 != (ulong *)0x0) {
                        *(undefined4 *)((long)local_108 + 0x1c) = 0xb;
                      }
                      local_128 = TINFL_STATUS_FAILED;
                    }
                  }
                  else {
                    local_e8 = local_108;
                    local_ec = 0xd;
                    if (local_108 != (ulong *)0x0) {
                      *(undefined4 *)((long)local_108 + 0x1c) = 0xd;
                    }
                    local_128 = TINFL_STATUS_FAILED;
                  }
                }
                if (*(long *)(local_108[0xd] + 0x80) == 0) {
                  (*(code *)local_108[6])(local_108[8],local_5c0);
                }
                if (local_5c8 != 0) {
                  (*(code *)local_108[6])(local_108[8],local_5c8);
                }
                local_100 = (uint)(local_128 == TINFL_STATUS_DONE);
              }
            }
            else {
              if (local_108 != (ulong *)0x0) {
                *(undefined4 *)((long)local_108 + 0x1c) = 9;
              }
              local_100 = 0;
            }
          }
          else {
            if (local_108 != (ulong *)0x0) {
              *(undefined4 *)((long)local_108 + 0x1c) = 0x14;
            }
            local_100 = 0;
          }
        }
      }
      else {
        if (local_108 != (ulong *)0x0) {
          *(undefined4 *)((long)local_108 + 0x1c) = 5;
        }
        local_100 = 0;
      }
    }
    else {
      local_100 = 1;
    }
  }
  return local_100;
}

Assistant:

inline mz_bool mz_zip_reader_extract_to_callback(mz_zip_archive* pZip,
                                                 mz_uint file_index,
                                                 mz_file_write_func pCallback,
                                                 void* pOpaque,
                                                 mz_uint flags) {

    int status = TINFL_STATUS_DONE;
    mz_uint file_crc32 = MZ_CRC32_INIT;
    mz_uint64 read_buf_size, read_buf_ofs = 0, read_buf_avail, comp_remaining, out_buf_ofs = 0, cur_file_ofs;
    mz_zip_archive_file_stat file_stat;
    void* pRead_buf = NULL;
    void* pWrite_buf = NULL;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8* pLocal_header = (mz_uint8*)local_header_u32;

    if ((!pZip) || (!pZip->m_pState) || (!pCallback) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_comp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_bit_flag
            & (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION
                    | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports decompressing stored and deflate. */
    if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    /* Read and do some minimal validation of the local directory entry (this doesn't crack the zip64 stuff, which we already have from the central dir) */
    cur_file_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque,
                      cur_file_ofs,
                      pLocal_header,
                      MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_file_ofs +=
            MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) + MZ_READ_LE16(
                    pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    /* Decompress the file either directly from memory or from a file input buffer. */
    if (pZip->m_pState->m_pMem) {
        pRead_buf = (mz_uint8*)pZip->m_pState->m_pMem + cur_file_ofs;
        read_buf_size = read_buf_avail = file_stat.m_comp_size;
        comp_remaining = 0;
    }
    else {
        read_buf_size = MZ_MIN(file_stat.m_comp_size, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
        if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)read_buf_size)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        read_buf_avail = 0;
        comp_remaining = file_stat.m_comp_size;
    }

    if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
        /* The file is stored or the caller has requested the compressed data. */
        if (pZip->m_pState->m_pMem) {
            if (((sizeof(size_t) == sizeof(mz_uint32))) && (file_stat.m_comp_size > MZ_UINT32_MAX))
                return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

            if (pCallback(pOpaque, out_buf_ofs, pRead_buf, (size_t)file_stat.m_comp_size) != file_stat.m_comp_size) {
                mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                status = TINFL_STATUS_FAILED;
            }
            else if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                file_crc32 = (mz_uint32)mz_crc32(file_crc32, (const mz_uint8*)pRead_buf, (size_t)file_stat.m_comp_size);
#endif
            }

            cur_file_ofs += file_stat.m_comp_size;
            out_buf_ofs += file_stat.m_comp_size;
            comp_remaining = 0;
        }
        else {
            while (comp_remaining) {
                read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
                if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail)
                        != read_buf_avail) {
                    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                    status = TINFL_STATUS_FAILED;
                    break;
                }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
                    file_crc32 = (mz_uint32)mz_crc32(file_crc32, (const mz_uint8*)pRead_buf, (size_t)read_buf_avail);
                }
#endif

                if (pCallback(pOpaque, out_buf_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail) {
                    mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                    status = TINFL_STATUS_FAILED;
                    break;
                }

                cur_file_ofs += read_buf_avail;
                out_buf_ofs += read_buf_avail;
                comp_remaining -= read_buf_avail;
            }
        }
    }
    else {
        tinfl_decompressor inflator;
        tinfl_init(&inflator);

        if (NULL == (pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, TINFL_LZ_DICT_SIZE))) {
            mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            status = TINFL_STATUS_FAILED;
        }
        else {
            do {
                mz_uint8* pWrite_buf_cur = (mz_uint8*)pWrite_buf + (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
                size_t in_buf_size, out_buf_size = TINFL_LZ_DICT_SIZE - (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
                if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
                    read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
                    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail)
                            != read_buf_avail) {
                        mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }
                    cur_file_ofs += read_buf_avail;
                    comp_remaining -= read_buf_avail;
                    read_buf_ofs = 0;
                }

                in_buf_size = (size_t)read_buf_avail;
                status = tinfl_decompress(&inflator,
                                          (const mz_uint8*)pRead_buf + read_buf_ofs,
                                          &in_buf_size,
                                          (mz_uint8*)pWrite_buf,
                                          pWrite_buf_cur,
                                          &out_buf_size,
                                          comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
                read_buf_avail -= in_buf_size;
                read_buf_ofs += in_buf_size;

                if (out_buf_size) {
                    if (pCallback(pOpaque, out_buf_ofs, pWrite_buf_cur, out_buf_size) != out_buf_size) {
                        mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                    file_crc32 = (mz_uint32)mz_crc32(file_crc32, pWrite_buf_cur, out_buf_size);
#endif
                    if ((out_buf_ofs += out_buf_size) > file_stat.m_uncomp_size) {
                        mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }
                }
            } while ((status == TINFL_STATUS_NEEDS_MORE_INPUT) || (status == TINFL_STATUS_HAS_MORE_OUTPUT));
        }
    }

    if ((status == TINFL_STATUS_DONE) && (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))) {
        /* Make sure the entire file was decompressed, and check its CRC. */
        if (out_buf_ofs != file_stat.m_uncomp_size) {
            mz_zip_set_error(pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
            status = TINFL_STATUS_FAILED;
        }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        else if (file_crc32 != file_stat.m_crc32) {
            mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
            status = TINFL_STATUS_FAILED;
        }
#endif
    }

    if (!pZip->m_pState->m_pMem)
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

    if (pWrite_buf)
        pZip->m_pFree(pZip->m_pAlloc_opaque, pWrite_buf);

    return status == TINFL_STATUS_DONE;
}